

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanNotBackUTF8(UnicodeSetStringSpan *this,uint8_t *s,int32_t length)

{
  uint8_t *puVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  UBool UVar6;
  UChar32 c;
  uint uVar7;
  uint8_t *puVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  int32_t local_50;
  int local_4c;
  UnicodeSet *local_48;
  UnicodeSetStringSpan *local_40;
  uint8_t *local_38;
  
  uVar3 = this->strings->count;
  lVar10 = 0;
  if (this->all != '\0') {
    lVar10 = (long)(int)uVar3 * 3;
  }
  local_38 = this->spanLengths + lVar10;
  local_48 = &this->spanSet;
  local_40 = this;
  do {
    length = UnicodeSet::spanBackUTF8
                       (local_40->pSpanNotSet,(char *)s,length,USET_SPAN_NOT_CONTAINED);
    if (length == 0) {
      return 0;
    }
    bVar2 = s[(long)length + -1];
    if ((char)bVar2 < '\0') {
      local_4c = length + -1;
      c = utf8_prevCharSafeBody_63(s,0,&local_4c,(uint)bVar2,-3);
      uVar13 = length - local_4c;
      UVar6 = UnicodeSet::contains(local_48,c);
      uVar7 = -uVar13;
      if (UVar6 != '\0') {
        uVar7 = uVar13;
      }
    }
    else {
      UVar6 = UnicodeSet::contains(local_48,(uint)bVar2);
      uVar7 = -(uint)(UVar6 == '\0') | 1;
    }
    if ((int)uVar7 < 1) {
      if (0 < (int)uVar3) {
        puVar8 = local_40->utf8;
        uVar9 = 0;
        do {
          iVar12 = local_40->utf8Lengths[uVar9];
          lVar10 = (long)iVar12;
          if (((lVar10 != 0) && (iVar12 <= length)) && (local_38[uVar9] != 0xff)) {
            lVar11 = 0;
            do {
              lVar5 = lVar11 + (length - lVar10);
              puVar1 = puVar8 + lVar11;
              if (s[lVar5] != *puVar1) break;
              lVar11 = lVar11 + 1;
              bVar4 = 1 < iVar12;
              iVar12 = iVar12 + -1;
            } while (bVar4);
            if (s[lVar5] == *puVar1) goto LAB_002e5d77;
          }
          puVar8 = puVar8 + lVar10;
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar3);
      }
      length = length + uVar7;
      bVar4 = true;
    }
    else {
LAB_002e5d77:
      bVar4 = false;
      local_50 = length;
    }
    if (!bVar4) {
      return local_50;
    }
    if (length == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int32_t UnicodeSetStringSpan::spanNotBackUTF8(const uint8_t *s, int32_t length) const {
    int32_t pos=length;
    int32_t i, stringsLength=strings.size();
    uint8_t *spanBackUTF8Lengths=spanLengths;
    if(all) {
        spanBackUTF8Lengths+=3*stringsLength;
    }
    do {
        // Span until we find a code point from the set,
        // or a code point that starts or ends some string.
        pos=pSpanNotSet->spanBackUTF8((const char *)s, pos, USET_SPAN_NOT_CONTAINED);
        if(pos==0) {
            return 0;  // Reached the start of the string.
        }

        // Check whether the current code point is in the original set,
        // without the string starts and ends.
        int32_t cpLength=spanOneBackUTF8(spanSet, s, pos);
        if(cpLength>0) {
            return pos;  // There is a set element at pos.
        }

        // Try to match the strings at pos.
        const uint8_t *s8=utf8;
        int32_t length8;
        for(i=0; i<stringsLength; ++i) {
            length8=utf8Lengths[i];
            // ALL_CP_CONTAINED: Irrelevant string.
            if(length8!=0 && spanBackUTF8Lengths[i]!=ALL_CP_CONTAINED && length8<=pos && matches8(s+pos-length8, s8, length8)) {
                return pos;  // There is a set element at pos.
            }
            s8+=length8;
        }

        // The span(while not contained) ended on a string start/end which is
        // not in the original set. Skip this code point and continue.
        // cpLength<0
        pos+=cpLength;
    } while(pos!=0);
    return 0;  // Reached the start of the string.
}